

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::eval_leftShiftVecScalar_ivec4(ShaderEvalContext *c)

{
  undefined1 auVar1 [16];
  Vector<int,_4> local_68;
  undefined1 local_58 [16];
  Vector<float,_4> local_40;
  _anonymous_namespace_ local_30 [16];
  
  auVar1 = *(undefined1 (*) [16])c->in[0].m_data;
  local_58._12_4_ = auVar1._0_4_;
  local_58._0_12_ = auVar1._4_12_;
  tcu::Vector<float,_4>::cast<int>(&local_40);
  tcu::Vector<int,_4>::Vector(&local_68,(int)c->in[1].m_data[0]);
  sr::(anonymous_namespace)::leftShift<int,4>(local_30,(Vector<int,_4> *)&local_40,&local_68);
  tcu::Vector<int,_4>::cast<float>(&local_68);
  *(undefined8 *)(c->color).m_data = local_68.m_data._0_8_;
  *(undefined8 *)((c->color).m_data + 2) = local_68.m_data._8_8_;
  return;
}

Assistant:

void eval_selection_int		(ShaderEvalContext& c) { c.color.x()	= (float)selection(c.in[0].z() > 0.0f,	(int)c.in[1].x(),						(int)c.in[2].y()); }